

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassDeserializeBinary
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  bool bVar1;
  Descriptor *descriptor;
  FieldDescriptor *field;
  Descriptor *in_R8;
  long lVar2;
  int i;
  long lVar3;
  string sStack_68;
  string local_48;
  
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&sStack_68,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,desc);
  io::Printer::Print(printer,
                     "/**\n * Deserializes binary data (in protobuf wire format).\n * @param {jspb.ByteSource} bytes The bytes to deserialize.\n * @return {!$class$}\n */\n$class$.deserializeBinary = function(bytes) {\n  var reader = new jspb.BinaryReader(bytes);\n  var msg = new $class$;\n  return $class$.deserializeBinaryFromReader(msg, reader);\n};\n\n\n/**\n * Deserializes binary data (in protobuf wire format) from the\n * given reader into the given message object.\n * @param {!$class$} msg The message object to deserialize into.\n * @param {!jspb.BinaryReader} reader The BinaryReader to use.\n * @return {!$class$}\n */\n$class$.deserializeBinaryFromReader = function(msg, reader) {\n  while (reader.nextField()) {\n    if (reader.isEndGroup()) {\n      break;\n    }\n    var field = reader.getFieldNumber();\n    switch (field) {\n"
                     ,"class",&sStack_68);
  std::__cxx11::string::~string((string *)&sStack_68);
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < *(int *)(desc + 0x2c); lVar3 = lVar3 + 1) {
    field = (FieldDescriptor *)(*(long *)(desc + 0x30) + lVar2);
    bVar1 = anon_unknown_0::IgnoreField(field);
    if (!bVar1) {
      GenerateClassDeserializeBinaryField
                ((Generator *)field,options,printer,
                 (FieldDescriptor *)(*(long *)(desc + 0x30) + lVar2));
    }
    lVar2 = lVar2 + 0xa8;
  }
  io::Printer::Print(printer,"    default:\n");
  if (*(int *)(desc + 0x68) < 1) {
    io::Printer::Print(printer,"      reader.skipField();\n      break;\n");
  }
  else {
    descriptor = desc;
    (anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
              (&sStack_68,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(desc + 0x10),
               (FileDescriptor *)desc,in_R8);
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_48,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,descriptor);
    io::Printer::Print(printer,
                       "      jspb.Message.readBinaryExtension(msg, reader, $extobj$Binary,\n        $class$.prototype.getExtension,\n        $class$.prototype.setExtension);\n      break;\n"
                       ,"extobj",&sStack_68,"class",&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&sStack_68);
  }
  io::Printer::Print(printer,"    }\n  }\n  return msg;\n};\n\n\n");
  return;
}

Assistant:

void Generator::GenerateClassDeserializeBinary(const GeneratorOptions& options,
                                               io::Printer* printer,
                                               const Descriptor* desc) const {
  // TODO(cfallin): Handle lazy decoding when requested by field option and/or
  // by default for 'bytes' fields and packed repeated fields.

  printer->Print(
      "/**\n"
      " * Deserializes binary data (in protobuf wire format).\n"
      " * @param {jspb.ByteSource} bytes The bytes to deserialize.\n"
      " * @return {!$class$}\n"
      " */\n"
      "$class$.deserializeBinary = function(bytes) {\n"
      "  var reader = new jspb.BinaryReader(bytes);\n"
      "  var msg = new $class$;\n"
      "  return $class$.deserializeBinaryFromReader(msg, reader);\n"
      "};\n"
      "\n"
      "\n"
      "/**\n"
      " * Deserializes binary data (in protobuf wire format) from the\n"
      " * given reader into the given message object.\n"
      " * @param {!$class$} msg The message object to deserialize into.\n"
      " * @param {!jspb.BinaryReader} reader The BinaryReader to use.\n"
      " * @return {!$class$}\n"
      " */\n"
      "$class$.deserializeBinaryFromReader = function(msg, reader) {\n"
      "  while (reader.nextField()) {\n"
      "    if (reader.isEndGroup()) {\n"
      "      break;\n"
      "    }\n"
      "    var field = reader.getFieldNumber();\n"
      "    switch (field) {\n",
      "class", GetMessagePath(options, desc));

  for (int i = 0; i < desc->field_count(); i++) {
    if (!IgnoreField(desc->field(i))) {
      GenerateClassDeserializeBinaryField(options, printer, desc->field(i));
    }
  }

  printer->Print(
      "    default:\n");
  if (IsExtendable(desc)) {
    printer->Print(
        "      jspb.Message.readBinaryExtension(msg, reader, $extobj$Binary,\n"
        "        $class$.prototype.getExtension,\n"
        "        $class$.prototype.setExtension);\n"
        "      break;\n",
        "extobj", JSExtensionsObjectName(options, desc->file(), desc),
        "class", GetMessagePath(options, desc));
  } else {
    printer->Print(
        "      reader.skipField();\n"
        "      break;\n");
  }

  printer->Print(
      "    }\n"
      "  }\n"
      "  return msg;\n"
      "};\n"
      "\n"
      "\n");
}